

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

void search_in_and_exp_files(string *path,list<int,_std::allocator<int>_> *files_to_run)

{
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__src;
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  string *psVar5;
  long *plVar6;
  flag_type __f;
  size_t *psVar7;
  undefined8 uStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string file_name;
  undefined1 local_68 [8];
  list<int,_std::allocator<int>_> in_files;
  list<int,_std::allocator<int>_> exp_files;
  int in;
  
  local_68 = (undefined1  [8])local_68;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
       = (_List_node_base *)0x0;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       (size_t)&in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
  exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  lVar2 = -((ulong)((int)path->_M_string_length + 1) + 0xf & 0xfffffffffffffff0);
  __src = (path->_M_dataplus)._M_p;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
       = (_List_node_base *)local_68;
  exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)
            in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
  *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10724a;
  strcpy((char *)((long)&local_f8 + lVar2),__src);
  *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107252;
  __dirp = opendir((char *)((long)&local_f8 + lVar2));
  if (__dirp != (DIR *)0x0) {
    this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
           (&file_name.field_2._M_allocated_capacity + 1);
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10;
    uVar1 = *(undefined8 *)((long)&uStack_100 + lVar2);
    while( true ) {
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10727c;
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) break;
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107293;
      std::__cxx11::string::string((string *)local_b8,pdVar4->d_name,(allocator *)this);
      __f = (flag_type)uVar1;
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072a5;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (this,"^in([0-9]+)\\.txt$",__f);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072b4;
      add_file_if_regex_ok(this,(list<int,_std::allocator<int>_> *)local_68,(string *)local_b8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072bc;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072ce;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (this,"^exp([0-9]+)\\.txt$",__f);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072dc;
      add_file_if_regex_ok
                (this,(list<int,_std::allocator<int>_> *)
                      &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,
                 (string *)local_b8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072e4;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072ec;
      std::__cxx11::string::~string((string *)local_b8);
    }
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072f6;
    closedir(__dirp);
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1072ff;
    std::__cxx11::list<int,_std::allocator<int>_>::sort((list<int,_std::allocator<int>_> *)local_68)
    ;
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107308;
    std::__cxx11::list<int,_std::allocator<int>_>::sort
              ((list<int,_std::allocator<int>_> *)
               &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (file_name.field_2._M_local_buf + 8);
    plVar6 = (long *)local_68;
    while (plVar6 = (long *)*plVar6, plVar6 != (long *)local_68) {
      iVar3 = *(int *)(plVar6 + 2);
      exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._4_4_ = iVar3;
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107346;
      std::__cxx11::to_string((string *)local_b8,iVar3);
      iVar3 = *(int *)(in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
                      + 0x10);
      if (iVar3 == exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size.
                   _4_4_) {
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107361;
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  (files_to_run,
                   (value_type_conflict1 *)
                   ((long)&exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                           _M_size + 4));
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10736a;
        std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                  ((list<int,_std::allocator<int>_> *)
                   &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      }
      else if (exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._4_4_ <
               iVar3 || (size_t *)
                        in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
                        == &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                            _M_size) {
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107393;
        std::operator+(&local_f8,".txt is present, but exp",(string *)local_b8);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073a5;
        std::operator+(__return_storage_ptr__,&local_f8,".txt missing -> Skipping test!\n");
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073b7;
        std::operator+(&local_d8,"in",(string *)local_b8);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073c2;
        psVar5 = (string *)std::__cxx11::string::append((string *)&local_d8);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1f;
        uVar1 = *(undefined8 *)((long)&uStack_100 + lVar2);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073cd;
        write_colored_text(psVar5,(Color)uVar1);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073d5;
        std::__cxx11::string::~string((string *)&local_d8);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073dd;
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073e5;
        std::__cxx11::string::~string((string *)&local_f8);
      }
      else {
        while (iVar3 < exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
                       ._4_4_) {
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107408;
          std::operator+(&local_f8,".txt is present, but in",(string *)local_b8);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10741a;
          std::operator+(__return_storage_ptr__,&local_f8,".txt missing -> Skipping test!\n");
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10742c;
          std::operator+(&local_d8,"exp",(string *)local_b8);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107437;
          psVar5 = (string *)std::__cxx11::string::append((string *)&local_d8);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1f;
          uVar1 = *(undefined8 *)((long)&uStack_100 + lVar2);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107442;
          write_colored_text(psVar5,(Color)uVar1);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10744a;
          std::__cxx11::string::~string((string *)&local_d8);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107452;
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10745a;
          std::__cxx11::string::~string((string *)&local_f8);
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107463;
          std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                    ((list<int,_std::allocator<int>_> *)
                     &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
          iVar3 = *(int *)(in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                           _M_size + 0x10);
        }
      }
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1073ed;
      std::__cxx11::string::~string((string *)local_b8);
    }
    psVar7 = &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    while (psVar7 = (size_t *)*psVar7,
          psVar7 != &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size) {
      iVar3 = *(int *)(psVar7 + 2);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074a7;
      std::__cxx11::to_string((string *)local_b8,iVar3);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074b9;
      std::operator+(&local_f8,".txt is present, but in",(string *)local_b8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074cb;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (file_name.field_2._M_local_buf + 8),&local_f8,
                     ".txt missing -> Skipping test!\n");
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074dd;
      std::operator+(&local_d8,"exp",(string *)local_b8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074e8;
      psVar5 = (string *)std::__cxx11::string::append((string *)&local_d8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1f;
      uVar1 = *(undefined8 *)((long)&uStack_100 + lVar2);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074f3;
      write_colored_text(psVar5,(Color)uVar1);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1074fb;
      std::__cxx11::string::~string((string *)&local_d8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107503;
      std::__cxx11::string::~string((string *)(file_name.field_2._M_local_buf + 8));
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x10750b;
      std::__cxx11::string::~string((string *)&local_f8);
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0x107513;
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  uStack_100 = 0x107525;
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)
             &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
  uStack_100 = 0x10752e;
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)local_68);
  return;
}

Assistant:

void search_in_and_exp_files(const string &path, list<int> &files_to_run) {
    struct dirent *entry;

    list<int> in_files;
    list<int> exp_files;

    // Convert string to char-array
    int length = path.size();
    char char_path[length + 1];
    strcpy(char_path, path.c_str());

    // Open the directory
    DIR *dir = opendir(char_path);
    if (dir == nullptr) return;

    // Read each filename from the directory
    while ((entry = readdir(dir)) != nullptr) {
        string file_name = entry->d_name;

        /*
         * I just want to search for in1.txt, in2.txt, ..., in15.txt, in16.txt, ...
         * And I just want to extract the number 1, 2, ..., 15, 16, ..
         * See https://regex101.com for nice interactive explaining of the regex.
         * - ^      -> must start with what follows
         * - ^in    -> must start with 'in'
         * - (...)  -> first capture group -> get with $1
         * - [0-9]+ -> at least one digit
         * - \\.    -> a dot has to be present (note: in many languages, just one \ is required, also on https://regex101.com/)
         * - txt$   -> must end with txt
         */
        add_file_if_regex_ok(regex("^in([0-9]+)\\.txt$"), in_files, file_name);
        add_file_if_regex_ok(regex("^exp([0-9]+)\\.txt$"), exp_files, file_name);
    }
    closedir(dir);

    // Sort the file-lists
    in_files.sort();
    exp_files.sort();

    // Only add files to 'files_to_run', if the inXX.txt AND the expXX.txt are present:
    for (int in : in_files) {
        string i = to_string(in);
        if (exp_files.front() == in) {
            files_to_run.push_back(in);
            exp_files.pop_front();
        } else if (exp_files.empty() || exp_files.front() > in) {
            write_colored_text("in" + i += ".txt is present, but exp" + i + ".txt missing -> Skipping test!\n");
        } else {
            while (exp_files.front() < in) {
                write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
                exp_files.pop_front();
            }
        }
    }
    // Possibly remaining exp-files (without in-files):
    for (int exp: exp_files) {
        string i = to_string(exp);
        write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
    }
}